

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_GAIN_EXP(effect_handler_context_t_conflict *context)

{
  wchar_t wVar1;
  
  wVar1 = effect_calculate_value(context,false);
  if (player->exp < 99999999) {
    msg("You feel more experienced.");
    player_exp_gain(player,wVar1 / 2);
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_GAIN_EXP(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	if (player->exp < PY_MAX_EXP) {
		msg("You feel more experienced.");
		player_exp_gain(player, amount / 2);
	}
	context->ident = true;

	return true;
}